

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EventTriggerStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventTriggerStatementSyntax,slang::syntax::EventTriggerStatementSyntax_const&>
          (BumpAllocator *this,EventTriggerStatementSyntax *args)

{
  EventTriggerStatementSyntax *pEVar1;
  EventTriggerStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pEVar1 = (EventTriggerStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::EventTriggerStatementSyntax::EventTriggerStatementSyntax(in_RSI,pEVar1);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }